

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticSynapse.cpp
# Opt level: O1

void __thiscall StaticSynapse::update(StaticSynapse *this)

{
  long lVar1;
  Population *pPVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  if (0 < this->outputSize) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      if (0 < this->inputSize) {
        lVar3 = 0;
        do {
          lVar1 = (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
          if ((lVar1 <= lVar3) ||
             ((this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols <= (long)uVar4)) {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x16d,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                         );
          }
          (**(((this->super_Synapse).from_population)->output).
             super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar3]->_vptr_Event)
                    (*(undefined8 *)
                      ((long)(this->weights).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data + lVar3 * 8 + lVar1 * lVar5));
          pPVar2 = (this->super_Synapse).to_population;
          (*pPVar2->_vptr_Population[5])
                    (pPVar2,uVar4 & 0xffffffff,
                     (((this->super_Synapse).from_population)->output).
                     super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < this->inputSize);
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 8;
    } while ((long)uVar4 < (long)this->outputSize);
  }
  return;
}

Assistant:

void StaticSynapse::update() {
    for(int i = 0; i < outputSize; i++) {
        for(int j = 0; j < inputSize; j++) {
            from_population->output[j]->setWeight(weights(j, i));
            to_population->setInput(i, from_population->output[j]);
        }
    }
}